

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecialFormat.cpp
# Opt level: O3

TrackData * GenerateLogoProfTrack(TrackData *__return_storage_ptr__,CylHead *cylhead,Track *track)

{
  Sector *pSVar1;
  bool bVar2;
  BitBuffer *bitstream;
  Sector *sector;
  Sector *sector_00;
  BitstreamTrackBuilder bitbuf;
  BitstreamTrackBuilder BStack_a8;
  
  bVar2 = IsLogoProfTrack(track);
  if (bVar2) {
    BitstreamTrackBuilder::BitstreamTrackBuilder(&BStack_a8,_250K,MFM);
    TrackBuilder::addTrackStart(&BStack_a8.super_TrackBuilder,false);
    TrackBuilder::addGap(&BStack_a8.super_TrackBuilder,600,-1);
    pSVar1 = (track->m_sectors).super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (sector_00 = (track->m_sectors).super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
                     super__Vector_impl_data._M_start; sector_00 != pSVar1;
        sector_00 = sector_00 + 1) {
      if ((sector_00->header).sector != 1) {
        TrackBuilder::addSector(&BStack_a8.super_TrackBuilder,sector_00,0x20);
      }
    }
    bitstream = BitstreamTrackBuilder::buffer(&BStack_a8);
    TrackData::TrackData(__return_storage_ptr__,cylhead,bitstream);
    if (BStack_a8.m_buffer.m_sync_losses.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(BStack_a8.m_buffer.m_sync_losses.super__Vector_base<int,_std::allocator<int>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)BStack_a8.m_buffer.m_sync_losses.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)BStack_a8.m_buffer.m_sync_losses.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (BStack_a8.m_buffer.m_indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(BStack_a8.m_buffer.m_indexes.super__Vector_base<int,_std::allocator<int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)BStack_a8.m_buffer.m_indexes.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)BStack_a8.m_buffer.m_indexes.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (BStack_a8.m_buffer.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(BStack_a8.m_buffer.m_data.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)BStack_a8.m_buffer.m_data.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)BStack_a8.m_buffer.m_data.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    return __return_storage_ptr__;
  }
  __assert_fail("IsLogoProfTrack(track)",
                "/workspace/llm4binary/github/license_c_cmakelists/simonowen[P]samdisk/src/SpecialFormat.cpp"
                ,0x251,"TrackData GenerateLogoProfTrack(const CylHead &, const Track &)");
}

Assistant:

TrackData GenerateLogoProfTrack(const CylHead& cylhead, const Track& track)
{
    assert(IsLogoProfTrack(track));

    BitstreamTrackBuilder bitbuf(DataRate::_250K, Encoding::MFM);
    bitbuf.addTrackStart();
    bitbuf.addGap(600);

    for (auto& sector : track)
    {
        if (sector.header.sector != 1)
            bitbuf.addSector(sector, 0x20);
    }

    return TrackData(cylhead, std::move(bitbuf.buffer()));
}